

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

array_container_t * array_container_from_run(run_container_t *arr)

{
  ushort uVar1;
  rle16_t *prVar2;
  uint16_t *puVar3;
  int32_t n_runs;
  uint uVar4;
  long lVar5;
  array_container_t *paVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint16_t uVar10;
  
  uVar4 = croaring_hardware_support();
  if ((uVar4 & 2) == 0) {
    uVar4 = croaring_hardware_support();
    if ((uVar4 & 1) == 0) {
      iVar8 = arr->n_runs;
      lVar5 = (long)iVar8;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          iVar8 = iVar8 + (uint)arr->runs[lVar7].length;
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
    }
    else {
      iVar8 = _avx2_run_container_cardinality(arr);
    }
  }
  else {
    iVar8 = _avx512_run_container_cardinality(arr);
  }
  paVar6 = array_container_create_given_capacity(iVar8);
  paVar6->cardinality = 0;
  iVar8 = arr->n_runs;
  if (0 < (long)iVar8) {
    prVar2 = arr->runs;
    puVar3 = paVar6->array;
    lVar5 = 0;
    lVar7 = 0;
    do {
      uVar10 = prVar2[lVar5].value;
      uVar1 = prVar2[lVar5].length;
      iVar9 = (int)lVar7;
      lVar7 = (long)iVar9;
      uVar4 = 0;
      do {
        puVar3[lVar7] = uVar10;
        lVar7 = lVar7 + 1;
        uVar4 = uVar4 - 1;
        uVar10 = uVar10 + 1;
      } while (~(uint)uVar1 != uVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar8);
    paVar6->cardinality = iVar9 - uVar4;
  }
  return paVar6;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}